

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_sample.cpp
# Opt level: O3

void duckdb::DuckDBTableSampleFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *this;
  FunctionData *pFVar1;
  _func_int **pp_Var2;
  GlobalTableFunctionState *pGVar3;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var4;
  _Alloc_hider _Var5;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var6;
  pointer pBVar7;
  pointer pDVar8;
  NotImplementedException *this_00;
  string local_48;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&data_p->bind_data);
  pFVar1 = (data_p->bind_data).ptr;
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pp_Var2 = pFVar1[4]._vptr_FunctionData;
  if (*(char *)(pp_Var2 + 2) != '\x01') {
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Unimplemented catalog type for pragma_table_sample","");
    NotImplementedException::NotImplementedException(this_00,&local_48);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pGVar3 = (data_p->global_state).ptr;
  this = pGVar3 + 2;
  if (pGVar3[2]._vptr_GlobalTableFunctionState == (_func_int **)0x0) {
    (**(code **)(*pp_Var2 + 0x90))(&local_48);
    _Var6._M_head_impl = (BlockingSample *)local_48._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)0x0;
    _Var4._M_head_impl =
         (((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_> *)
          &this->_vptr_GlobalTableFunctionState)->_M_t).
         super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
         .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl;
    (((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_> *)
     &this->_vptr_GlobalTableFunctionState)->_M_t).
    super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
    super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl = _Var6._M_head_impl;
    if (_Var4._M_head_impl != (BlockingSample *)0x0) {
      (**(code **)((long)(_Var4._M_head_impl)->_vptr_BlockingSample + 8))();
      if ((DataChunk *)local_48._M_dataplus._M_p != (DataChunk *)0x0) {
        (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
      }
      _Var6._M_head_impl =
           (((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_> *)
            &this->_vptr_GlobalTableFunctionState)->_M_t).
           super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
           .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl;
    }
    if (_Var6._M_head_impl == (BlockingSample *)0x0) {
      return;
    }
  }
  pBVar7 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
           operator->((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                       *)this);
  (*pBVar7->_vptr_BlockingSample[6])(&local_48,pBVar7);
  if ((DataChunk *)local_48._M_dataplus._M_p != (DataChunk *)0x0) {
    pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                         *)&local_48);
    DataChunk::Copy(pDVar8,output,0);
    pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                       ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                         *)&local_48);
    _Var5._M_p = local_48._M_dataplus._M_p;
    pGVar3[1]._vptr_GlobalTableFunctionState =
         (_func_int **)((long)pGVar3[1]._vptr_GlobalTableFunctionState + pDVar8->count);
    if ((DataChunk *)local_48._M_dataplus._M_p != (DataChunk *)0x0) {
      DataChunk::~DataChunk((DataChunk *)local_48._M_dataplus._M_p);
      operator_delete(_Var5._M_p);
    }
  }
  return;
}

Assistant:

static void DuckDBTableSampleFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &bind_data = data_p.bind_data->Cast<DuckDBTableSampleFunctionData>();
	auto &state = data_p.global_state->Cast<DuckDBTableSampleOperatorData>();
	switch (bind_data.entry.type) {
	case CatalogType::TABLE_ENTRY:
		DuckDBTableSampleTable(context, state, bind_data.entry.Cast<TableCatalogEntry>(), output);
		break;
	default:
		throw NotImplementedException("Unimplemented catalog type for pragma_table_sample");
	}
}